

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-math.c
# Opt level: O0

int rtosc_arg_val_round(rtosc_arg_val_t *av)

{
  int iVar1;
  int tmp;
  rtosc_arg_val_t *av_local;
  
  iVar1 = (int)av->type;
  if (((iVar1 != 0x46) && (iVar1 != 0x54)) && (iVar1 != 99)) {
    if (iVar1 == 100) {
      (av->val).d = (double)(int)((int)(av->val).d +
                                 (uint)(0.999 <= (av->val).d - (double)(int)(av->val).d));
      return 1;
    }
    if (iVar1 == 0x66) {
      (av->val).f = (float)(int)((int)(av->val).f +
                                (uint)(0.999 <= (av->val).f - (float)(int)(av->val).f));
      return 1;
    }
    if (1 < iVar1 - 0x68U) {
      return 0;
    }
  }
  return 1;
}

Assistant:

int rtosc_arg_val_round(rtosc_arg_val_t* av)
{
    int tmp;
    switch(av->type)
    {
        case 'd':
            tmp = (int)(av->val.d);
            av->val.d = tmp + (int)(av->val.d - tmp >= 0.999);
            return true;
        case 'f':
            tmp = (int)(av->val.f);
            av->val.f = tmp + (int)(av->val.f - tmp >= 0.999f);
            return true;
        case 'h':
        case 'c':
        case 'i':
        case 'T':
        case 'F':
            return true;
        default:
            return false;
    }
}